

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileParser::getHomogeneousVector3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  DeadlyImportError *this_01;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  aiVector3t<float> local_6c;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  ai_real local_28;
  ai_real local_24;
  ai_real w;
  ai_real z;
  ai_real y;
  ai_real x;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_local;
  ObjFileParser *this_local;
  
  _y = point3d_array;
  point3d_array_local = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this;
  copyNextWord(this,this->m_buffer,0x1000);
  z = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  w = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_24 = fast_atof(this->m_buffer);
  copyNextWord(this,this->m_buffer,0x1000);
  local_28 = fast_atof(this->m_buffer);
  this_00 = _y;
  if ((local_28 == 0.0) && (!NAN(local_28))) {
    local_5d = 1;
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"OBJ: Invalid component in homogeneous vector (Division by zero)"
               ,&local_49);
    DeadlyImportError::DeadlyImportError(this_01,&local_48);
    local_5d = 0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  aiVector3t<float>::aiVector3t(&local_6c,z / local_28,w / local_28,local_24 / local_28);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(this_00,&local_6c);
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getHomogeneousVector3( std::vector<aiVector3D> &point3d_array ) {
    ai_real x, y, z, w;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    copyNextWord( m_buffer, Buffersize );
    w = ( ai_real ) fast_atof( m_buffer );

    if (w == 0)
      throw DeadlyImportError("OBJ: Invalid component in homogeneous vector (Division by zero)");

    point3d_array.push_back( aiVector3D( x/w, y/w, z/w ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}